

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

_Bool bmp_read_dib_header(FILE *fp,bmp_dib_header_t *header)

{
  size_t sVar1;
  _Bool local_19;
  bmp_dib_header_t *header_local;
  FILE *fp_local;
  
  if (fp == (FILE *)0x0) {
    __assert_fail("fp",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/samples/convert.c/main.c"
                  ,0x42,"_Bool bmp_read_dib_header(FILE *, bmp_dib_header_t *)");
  }
  if (header != (bmp_dib_header_t *)0x0) {
    sVar1 = fread(header,4,1,(FILE *)fp);
    local_19 = false;
    if ((sVar1 != 0) && (local_19 = false, 0x27 < header->header_size)) {
      sVar1 = fread(&header->width,4,1,(FILE *)fp);
      local_19 = false;
      if (sVar1 != 0) {
        sVar1 = fread(&header->height,4,1,(FILE *)fp);
        local_19 = false;
        if (sVar1 != 0) {
          sVar1 = fread(&header->number_planes,2,1,(FILE *)fp);
          local_19 = false;
          if (sVar1 != 0) {
            sVar1 = fread(&header->depth,2,1,(FILE *)fp);
            local_19 = false;
            if (sVar1 != 0) {
              sVar1 = fread(&header->compress_type,4,1,(FILE *)fp);
              local_19 = false;
              if (sVar1 != 0) {
                sVar1 = fread(&header->bmp_byte_size,4,1,(FILE *)fp);
                local_19 = false;
                if (sVar1 != 0) {
                  sVar1 = fread(&header->horizontal_resolution,4,1,(FILE *)fp);
                  local_19 = false;
                  if (sVar1 != 0) {
                    sVar1 = fread(&header->vertical_resolution,4,1,(FILE *)fp);
                    local_19 = false;
                    if (sVar1 != 0) {
                      sVar1 = fread(&header->number_colors,4,1,(FILE *)fp);
                      local_19 = false;
                      if (sVar1 != 0) {
                        sVar1 = fread(&header->number_important_colors,4,1,(FILE *)fp);
                        local_19 = sVar1 != 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    return local_19;
  }
  __assert_fail("header",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/samples/convert.c/main.c"
                ,0x43,"_Bool bmp_read_dib_header(FILE *, bmp_dib_header_t *)");
}

Assistant:

static bool bmp_read_dib_header(FILE* fp, bmp_dib_header_t* header)
{
    assert(fp);
    assert(header);

    return fread(&header->header_size, sizeof header->header_size, 1, fp) && header->header_size >= 40 &&
           fread(&header->width, sizeof header->width, 1, fp) && fread(&header->height, sizeof header->height, 1, fp) &&
           fread(&header->number_planes, sizeof header->number_planes, 1, fp) &&
           fread(&header->depth, sizeof header->depth, 1, fp) &&
           fread(&header->compress_type, sizeof header->compress_type, 1, fp) &&
           fread(&header->bmp_byte_size, sizeof header->bmp_byte_size, 1, fp) &&
           fread(&header->horizontal_resolution, sizeof header->horizontal_resolution, 1, fp) &&
           fread(&header->vertical_resolution, sizeof header->vertical_resolution, 1, fp) &&
           fread(&header->number_colors, sizeof header->number_colors, 1, fp) &&
           fread(&header->number_important_colors, sizeof header->number_important_colors, 1, fp);
}